

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O3

double ipx::Infnorm(SparseMatrix *A)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  double *__s;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  Vector rowsum;
  Vector local_30;
  double local_20;
  
  local_30._M_size = (size_t)A->nrow_;
  uVar8 = local_30._M_size << 3;
  __s = (double *)operator_new(uVar8);
  local_30._M_data = __s;
  memset(__s,0,uVar8);
  piVar3 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (int)((ulong)((long)(A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
  if (0 < (int)uVar6) {
    piVar4 = (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      lVar7 = (long)piVar3[uVar8];
      iVar1 = piVar3[uVar8 + 1];
      if (piVar3[uVar8] < iVar1) {
        do {
          iVar2 = piVar4[lVar7];
          __s[iVar2] = ABS(pdVar5[lVar7]) + __s[iVar2];
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  local_20 = Infnorm(&local_30);
  operator_delete(local_30._M_data);
  return local_20;
}

Assistant:

double Infnorm(const SparseMatrix& A) {
    Vector rowsum(A.rows());
    for (Int j = 0; j < A.cols(); j++) {
        for (Int p = A.begin(j); p < A.end(j); p++)
            rowsum[A.index(p)] += std::abs(A.value(p));
    }
    return Infnorm(rowsum);
}